

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

Real __thiscall amrex::MLNodeLinOp::AnyNormInfMask(MLNodeLinOp *this,int amrlev,Any *a,bool local)

{
  MultiFab *mf;
  _Head_base<0UL,_amrex::iMultiFab_*,_false> fine_mask;
  Real RVar1;
  
  mf = Any::get<amrex::MultiFab>(a);
  if ((this->super_MLLinOp).m_num_amr_levels + -1 == amrlev) {
    fine_mask._M_head_impl = (iMultiFab *)0x0;
  }
  else {
    fine_mask._M_head_impl =
         *(iMultiFab **)
          &(this->m_norm_fine_mask).
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
  }
  RVar1 = MLLinOp::MFNormInf(&this->super_MLLinOp,mf,fine_mask._M_head_impl,local);
  return RVar1;
}

Assistant:

Real
MLNodeLinOp::AnyNormInfMask (int amrlev, Any const& a, bool local) const
{
    AMREX_ASSERT(a.is<MultiFab>());
    auto& mf = a.get<MultiFab>();

    const int finest_level = NAMRLevels() - 1;
    iMultiFab const* fine_mask = (amrlev == finest_level)
        ? nullptr : m_norm_fine_mask[amrlev].get();
    return MFNormInf(mf, fine_mask, local);
}